

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Annotation *a)

{
  pointer pPVar1;
  Property *property;
  pointer pPVar2;
  
  ASTVisitor::visit(&this->super_ASTVisitor,a);
  pPVar1 = (a->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (a->properties).
                super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    checkPropertyValue((pPVar2->value).object);
  }
  return;
}

Assistant:

void visit (AST::Annotation& a) override
        {
            super::visit (a);

            for (auto& property : a.properties)
                checkPropertyValue (property.value);
        }